

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::ServiceGenerator,google::protobuf::ServiceDescriptor>
          (java *this,string *package_dir,string *java_package,ServiceDescriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool annotate_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list,string *name_suffix,ServiceGenerator *generator,
          offset_in_ServiceGenerator_to_subr pfn)

{
  string *psVar1;
  ZeroCopyOutputStream *pZVar2;
  FileDescriptor *this_00;
  ulong uVar3;
  undefined7 in_stack_00000009;
  code *local_208;
  AnnotationCollector *local_1e8;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_1b0;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> info_output;
  Printer printer;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  string info_full_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string filename;
  offset_in_ServiceGenerator_to_subr pfn_local;
  bool annotate_code_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *context_local;
  ServiceDescriptor *descriptor_local;
  string *java_package_local;
  string *package_dir_local;
  
  filename.field_2._8_8_ = generator;
  psVar1 = ServiceDescriptor::name_abi_cxx11_((ServiceDescriptor *)java_package);
  std::operator+(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,psVar1);
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 annotation_list);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,".java");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,(value_type *)local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &annotations.annotation_.super_RepeatedPtrFieldBase.rep_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 ".pb.meta");
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&annotation_collector.annotation_proto_)
  ;
  io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
            ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&output,
             (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
  pZVar2 = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,local_68);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
             &printer.annotation_collector_,pZVar2);
  pZVar2 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                     ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                      &printer.annotation_collector_);
  if (((ulong)file_list & 1) == 0) {
    local_1e8 = (AnnotationCollector *)0x0;
  }
  else {
    local_1e8 = (AnnotationCollector *)&output;
  }
  io::Printer::Printer((Printer *)&info_output,pZVar2,'$',local_1e8);
  this_00 = ServiceDescriptor::file((ServiceDescriptor *)java_package);
  psVar1 = FileDescriptor::name_abi_cxx11_(this_00);
  io::Printer::Print((Printer *)&info_output,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",psVar1);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    io::Printer::Print((Printer *)&info_output,"package $package$;\n\n","package",package_dir);
  }
  if ((filename.field_2._8_8_ & 1) == 0) {
    local_208 = (code *)filename.field_2._8_8_;
  }
  else {
    local_208 = *(code **)(*(long *)(&name_suffix->_M_dataplus + pfn) + filename.field_2._8_8_ + -1)
    ;
  }
  (*local_208)(&name_suffix->_M_dataplus + pfn,&info_output);
  if (((ulong)file_list & 1) != 0) {
    pZVar2 = (ZeroCopyOutputStream *)
             (**(code **)(*(long *)descriptor + 0x10))
                       (descriptor,&annotations.annotation_.super_RepeatedPtrFieldBase.rep_);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr(&local_1b0,pZVar2);
    pZVar2 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_1b0);
    MessageLite::SerializeToZeroCopyStream
              ((MessageLite *)&annotation_collector.annotation_proto_,pZVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_00000009,annotate_code),
                (value_type *)&annotations.annotation_.super_RepeatedPtrFieldBase.rep_);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_1b0);
  }
  io::Printer::~Printer((Printer *)&info_output);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
             &printer.annotation_collector_);
  io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
            ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&output);
  GeneratedCodeInfo::~GeneratedCodeInfo
            ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
  std::__cxx11::string::~string((string *)&annotations.annotation_.super_RepeatedPtrFieldBase.rep_);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

static void GenerateSibling(const string& package_dir,
                            const string& java_package,
                            const DescriptorClass* descriptor,
                            GeneratorContext* context,
                            std::vector<string>* file_list, bool annotate_code,
                            std::vector<string>* annotation_list,
                            const string& name_suffix,
                            GeneratorClass* generator,
                            void (GeneratorClass::*pfn)(io::Printer* printer)) {
  string filename = package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);
  string info_full_path = filename + ".pb.meta";
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : NULL);

  printer.Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
      "package $package$;\n"
      "\n",
      "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}